

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddhcal.cpp
# Opt level: O0

int32_t __thiscall icu_63::BuddhistCalendar::handleGetExtendedYear(BuddhistCalendar *this)

{
  UCalendarDateFields UVar1;
  undefined4 local_14;
  int32_t year;
  BuddhistCalendar *this_local;
  
  UVar1 = Calendar::newerField((Calendar *)this,UCAL_EXTENDED_YEAR,UCAL_YEAR);
  if (UVar1 == UCAL_EXTENDED_YEAR) {
    local_14 = Calendar::internalGet((Calendar *)this,UCAL_EXTENDED_YEAR,0x7b2);
  }
  else {
    local_14 = Calendar::internalGet((Calendar *)this,UCAL_YEAR,0x9d1);
    local_14 = local_14 + -0x21f;
  }
  return local_14;
}

Assistant:

int32_t BuddhistCalendar::handleGetExtendedYear()
{
    // EXTENDED_YEAR in BuddhistCalendar is a Gregorian year.
    // The default value of EXTENDED_YEAR is 1970 (Buddhist 2513)
    int32_t year;
    if (newerField(UCAL_EXTENDED_YEAR, UCAL_YEAR) == UCAL_EXTENDED_YEAR) {
        year = internalGet(UCAL_EXTENDED_YEAR, kGregorianEpoch);
    } else {
        // extended year is a gregorian year, where 1 = 1AD,  0 = 1BC, -1 = 2BC, etc 
        year = internalGet(UCAL_YEAR, kGregorianEpoch - kBuddhistEraStart)
                + kBuddhistEraStart;
    }
    return year;
}